

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::Utils::shaderCompilationException::shaderCompilationException
          (shaderCompilationException *this,GLchar *source,GLchar *message)

{
  GLchar *pGVar1;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  GLchar *local_20;
  GLchar *message_local;
  GLchar *source_local;
  shaderCompilationException *this_local;
  
  local_20 = message;
  message_local = source;
  source_local = (GLchar *)this;
  std::exception::exception(&this->super_exception);
  pGVar1 = message_local;
  *(undefined ***)this = &PTR__shaderCompilationException_03266360;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_shader_source,pGVar1,&local_21);
  std::allocator<char>::~allocator(&local_21);
  pGVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_error_message,pGVar1,local_35);
  std::allocator<char>::~allocator(local_35);
  return;
}

Assistant:

Utils::shaderCompilationException::shaderCompilationException(const glw::GLchar* source, const glw::GLchar* message)
	: m_shader_source(source), m_error_message(message)
{
	/* Nothing to be done */
}